

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckerboardPatternOfAsterisks.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 1;
  do {
    if ((uVar1 & 1) == 0) {
      putchar(0x20);
    }
    iVar2 = 8;
    do {
      printf("%s","* ");
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    putchar(10);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 9);
  return 0;
}

Assistant:

int main (void) {
    int externalCounter = 1;
    int internalCounter = 1;

    while (externalCounter <= 8) {
        if (externalCounter % 2 == 0) {
            printf("%s", " ");

        }
        while (internalCounter <= 8) {
            printf("%s", "* ");
            internalCounter++;

        }
        puts("");
        externalCounter++;
        internalCounter = 1;

    }

    return 0;

}